

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscriber_link.cpp
# Opt level: O2

void __thiscall miniros::SubscriberLink::~SubscriberLink(SubscriberLink *this)

{
  this->_vptr_SubscriberLink = (_func_int **)&PTR__SubscriberLink_002f1b78;
  std::__cxx11::string::~string((string *)&this->topic_);
  std::__cxx11::string::~string((string *)&this->destination_caller_id_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->parent_).super___weak_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<miniros::SubscriberLink>)._M_weak_this.
              super___weak_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

SubscriberLink::~SubscriberLink()
{

}